

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll-oob.c
# Opt level: O3

int run_test_poll_oob(void)

{
  char *__s1;
  int iVar1;
  int iVar2;
  uint uVar3;
  int extraout_EAX;
  uv_loop_t *puVar4;
  int *piVar5;
  ssize_t sVar6;
  void *pvVar7;
  uint extraout_EDX;
  char *unaff_RBX;
  uv_stream_t *server;
  uv_handle_t *puVar8;
  uv__queue *unaff_R14;
  uv__queue *unaff_R15;
  int64_t eval_b;
  int64_t eval_a;
  sockaddr_in addr;
  uv_handle_t uStack_90;
  void *pvStack_50;
  uv_loop_t *puStack_48;
  uv__queue *puStack_40;
  uv__queue *local_38;
  undefined1 local_30 [24];
  
  iVar2 = (int)&local_38;
  puStack_40 = (uv__queue *)0x1b143b;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,(sockaddr_in *)(local_30 + 8));
  local_30._0_8_ = SEXT48(iVar1);
  local_38 = (uv__queue *)0x0;
  if ((uv__queue *)local_30._0_8_ == (uv__queue *)0x0) {
    puStack_40 = (uv__queue *)0x1b145e;
    unaff_RBX = (char *)uv_default_loop();
    puStack_40 = (uv__queue *)0x1b1470;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&server_handle);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b1742;
    puStack_40 = (uv__queue *)0x1b149d;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&client_handle);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b174f;
    puStack_40 = (uv__queue *)0x1b14ca;
    iVar1 = uv_tcp_init((uv_loop_t *)unaff_RBX,&peer_handle);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b175c;
    puStack_40 = (uv__queue *)0x1b14f7;
    iVar1 = uv_idle_init((uv_loop_t *)unaff_RBX,&idle);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b1769;
    puStack_40 = (uv__queue *)0x1b1528;
    iVar1 = uv_tcp_bind(&server_handle,(sockaddr *)(local_30 + 8),0);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b1776;
    puStack_40 = (uv__queue *)0x1b155e;
    iVar1 = uv_listen((uv_stream_t *)&server_handle,1,connection_cb);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b1783;
    puStack_40 = (uv__queue *)0x1b158d;
    iVar1 = uv_tcp_nodelay(&client_handle,1);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b1790;
    puStack_40 = (uv__queue *)0x1b15bc;
    client_fd = socket(2,1,0);
    local_30._0_8_ = SEXT48(client_fd);
    local_38 = (uv__queue *)0x0;
    if ((long)local_30._0_8_ < 0) goto LAB_001b179d;
    puStack_40 = (uv__queue *)0x1b15e5;
    unaff_R14 = (uv__queue *)__errno_location();
    unaff_R15 = (uv__queue *)(local_30 + 8);
    do {
      *(int *)&unaff_R14->next = 0;
      puStack_40 = (uv__queue *)0x1b1607;
      iVar1 = connect(client_fd,(sockaddr *)unaff_R15,0x10);
      if (iVar1 != -1) break;
    } while (*(int *)&unaff_R14->next == 4);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b17aa;
    puStack_40 = (uv__queue *)0x1b163a;
    iVar1 = uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_30._0_8_ = SEXT48(iVar1);
    local_38 = (uv__queue *)0x0;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0x0) goto LAB_001b17b7;
    local_30._0_8_ = SEXT48(ticks);
    local_38 = (uv__queue *)0xa;
    if ((uv__queue *)local_30._0_8_ != (uv__queue *)0xa) goto LAB_001b17c4;
    local_30._0_8_ = (uv__queue *)0x1;
    local_38 = (uv__queue *)(ulong)cli_pr_check;
    if (local_38 != (uv__queue *)0x1) goto LAB_001b17d1;
    local_30._0_8_ = (uv__queue *)0x2;
    local_38 = (uv__queue *)(ulong)(uint)cli_rd_check;
    if (local_38 != (uv__queue *)0x2) goto LAB_001b17de;
    local_30._0_8_ = (uv__queue *)0x1;
    local_38 = (uv__queue *)(ulong)srv_rd_check;
    if (local_38 != (uv__queue *)0x1) goto LAB_001b17eb;
    puStack_40 = (uv__queue *)0x1b16f4;
    uv_walk((uv_loop_t *)unaff_RBX,close_walk_cb,(void *)0x0);
    puStack_40 = (uv__queue *)0x1b16fe;
    uv_run((uv_loop_t *)unaff_RBX,UV_RUN_DEFAULT);
    local_30._0_8_ = (uv__queue *)0x0;
    puStack_40 = (uv__queue *)0x1b170f;
    iVar1 = uv_loop_close((uv_loop_t *)unaff_RBX);
    local_38 = (uv__queue *)(long)iVar1;
    if ((uv__queue *)local_30._0_8_ == local_38) {
      puStack_40 = (uv__queue *)0x1b1729;
      uv_library_shutdown();
      return 0;
    }
  }
  else {
    puStack_40 = (uv__queue *)0x1b1742;
    run_test_poll_oob_cold_1();
LAB_001b1742:
    puStack_40 = (uv__queue *)0x1b174f;
    run_test_poll_oob_cold_2();
LAB_001b174f:
    puStack_40 = (uv__queue *)0x1b175c;
    run_test_poll_oob_cold_3();
LAB_001b175c:
    puStack_40 = (uv__queue *)0x1b1769;
    run_test_poll_oob_cold_4();
LAB_001b1769:
    puStack_40 = (uv__queue *)0x1b1776;
    run_test_poll_oob_cold_5();
LAB_001b1776:
    puStack_40 = (uv__queue *)0x1b1783;
    run_test_poll_oob_cold_6();
LAB_001b1783:
    puStack_40 = (uv__queue *)0x1b1790;
    run_test_poll_oob_cold_7();
LAB_001b1790:
    puStack_40 = (uv__queue *)0x1b179d;
    run_test_poll_oob_cold_8();
LAB_001b179d:
    puStack_40 = (uv__queue *)0x1b17aa;
    run_test_poll_oob_cold_16();
LAB_001b17aa:
    puStack_40 = (uv__queue *)0x1b17b7;
    run_test_poll_oob_cold_9();
LAB_001b17b7:
    puStack_40 = (uv__queue *)0x1b17c4;
    run_test_poll_oob_cold_10();
LAB_001b17c4:
    puStack_40 = (uv__queue *)0x1b17d1;
    run_test_poll_oob_cold_11();
LAB_001b17d1:
    puStack_40 = (uv__queue *)0x1b17de;
    run_test_poll_oob_cold_12();
LAB_001b17de:
    puStack_40 = (uv__queue *)0x1b17eb;
    run_test_poll_oob_cold_13();
LAB_001b17eb:
    puStack_40 = (uv__queue *)0x1b17f8;
    run_test_poll_oob_cold_14();
  }
  server = (uv_stream_t *)local_30;
  puStack_40 = (uv__queue *)connection_cb;
  run_test_poll_oob_cold_15();
  pvStack_50 = (void *)(long)iVar2;
  uStack_90._56_8_ = 0;
  puStack_48 = (uv_loop_t *)unaff_RBX;
  puStack_40 = unaff_R14;
  if (pvStack_50 == (void *)0x0) {
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1839;
    iVar1 = uv_accept(server,(uv_stream_t *)&peer_handle);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 != (void *)0x0) goto LAB_001b1a5b;
    uStack_90.handle_queue.prev = (uv__queue *)0x1b186c;
    iVar1 = uv_fileno((uv_handle_t *)&peer_handle,&server_fd);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 != (void *)0x0) goto LAB_001b1a6a;
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1891;
    puVar4 = uv_default_loop();
    uStack_90.handle_queue.prev = (uv__queue *)0x1b18a6;
    iVar1 = uv_poll_init(puVar4,poll_req,client_fd);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 != (void *)0x0) goto LAB_001b1a79;
    uStack_90.handle_queue.prev = (uv__queue *)0x1b18cb;
    puVar4 = uv_default_loop();
    uStack_90.handle_queue.prev = (uv__queue *)0x1b18e0;
    iVar1 = uv_poll_init(puVar4,poll_req + 1,server_fd);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 != (void *)0x0) goto LAB_001b1a88;
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1918;
    iVar1 = uv_poll_start(poll_req,0xb,poll_cb);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 != (void *)0x0) goto LAB_001b1a97;
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1950;
    iVar1 = uv_poll_start(poll_req + 1,1,poll_cb);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 != (void *)0x0) goto LAB_001b1aa6;
    unaff_RBX = "hello";
    pvStack_50 = (void *)0x0;
    do {
      uStack_90.handle_queue.prev = (uv__queue *)0x1b198f;
      unaff_R14 = (uv__queue *)send(server_fd,"hello",5,1);
      if (-1 < (int)unaff_R14) break;
      uStack_90.handle_queue.prev = (uv__queue *)0x1b199c;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    pvStack_50 = (void *)0x5;
    uStack_90._56_8_ = SEXT48((int)unaff_R14);
    if (uStack_90._56_8_ != 5) goto LAB_001b1ab5;
    unaff_RBX = "world";
    uStack_90.flags = 5;
    uStack_90._60_4_ = 0;
    do {
      uStack_90.handle_queue.prev = (uv__queue *)0x1b19de;
      unaff_R14 = (uv__queue *)send(server_fd,"world",5,0);
      if (-1 < (int)unaff_R14) break;
      uStack_90.handle_queue.prev = (uv__queue *)0x1b19eb;
      piVar5 = __errno_location();
    } while (*piVar5 == 4);
    pvStack_50 = (void *)0x5;
    uStack_90._56_8_ = SEXT48((int)unaff_R14);
    if (uStack_90._56_8_ != 5) goto LAB_001b1ac4;
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1a24;
    iVar1 = uv_idle_start(&idle,idle_cb);
    pvStack_50 = (void *)(long)iVar1;
    uStack_90._56_8_ = 0;
    if (pvStack_50 == (void *)0x0) {
      return iVar1;
    }
  }
  else {
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1a5b;
    connection_cb_cold_1();
LAB_001b1a5b:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1a6a;
    connection_cb_cold_2();
LAB_001b1a6a:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1a79;
    connection_cb_cold_3();
LAB_001b1a79:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1a88;
    connection_cb_cold_4();
LAB_001b1a88:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1a97;
    connection_cb_cold_5();
LAB_001b1a97:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1aa6;
    connection_cb_cold_6();
LAB_001b1aa6:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1ab5;
    connection_cb_cold_7();
LAB_001b1ab5:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1ac4;
    connection_cb_cold_8();
LAB_001b1ac4:
    uStack_90.handle_queue.prev = (uv__queue *)0x1b1ad3;
    connection_cb_cold_9();
  }
  puVar8 = (uv_handle_t *)&pvStack_50;
  uStack_90.handle_queue.prev = (uv__queue *)poll_cb;
  connection_cb_cold_10();
  uStack_90.close_cb = (uv_close_cb)unaff_RBX;
  uStack_90.handle_queue.next = unaff_R14;
  uStack_90.handle_queue.prev = unaff_R15;
  iVar1 = uv_fileno(puVar8,(uv_os_fd_t *)&uStack_90.field_0x14);
  uStack_90.data = (void *)(long)iVar1;
  if (uStack_90.data == (void *)0x0) {
    uStack_90.loop._4_4_ = 0;
    uStack_90.type._0_1_ = UV_UNKNOWN_HANDLE;
    if ((extraout_EDX & 8) != 0) {
      do {
        sVar6 = recv(client_fd,(void *)((long)&uStack_90.loop + 4),5,1);
        if ((int)sVar6 != -1) {
          if (-1 < (int)sVar6) goto LAB_001b1b6f;
          piVar5 = __errno_location();
          iVar1 = *piVar5;
          break;
        }
        piVar5 = __errno_location();
        iVar1 = *piVar5;
      } while (iVar1 == 4);
      if (iVar1 != 0x16) {
LAB_001b1b6f:
        cli_pr_check = 1;
        iVar1 = uv_poll_stop(poll_req);
        uStack_90.data = (void *)(long)iVar1;
        if (uStack_90.data != (void *)0x0) goto LAB_001b1ec1;
        iVar1 = uv_poll_start(poll_req,3,poll_cb);
        uStack_90.data = (void *)(long)iVar1;
        if (uStack_90.data == (void *)0x0) goto LAB_001b1bd6;
        goto LAB_001b1ece;
      }
      goto LAB_001b1ee8;
    }
LAB_001b1bd6:
    pvVar7 = uStack_90.data;
    if ((extraout_EDX & 1) == 0) goto LAB_001b1e5c;
    if (uStack_90._20_4_ != client_fd) goto LAB_001b1da5;
    do {
      sVar6 = recv(client_fd,(void *)((long)&uStack_90.loop + 4),5,0);
      iVar1 = (int)sVar6;
      if (iVar1 != -1) {
        if (-1 < iVar1) goto LAB_001b1c35;
        piVar5 = __errno_location();
        iVar2 = *piVar5;
        break;
      }
      piVar5 = __errno_location();
      iVar2 = *piVar5;
    } while (iVar2 == 4);
    if (iVar2 == 0x16) goto LAB_001b1f07;
LAB_001b1c35:
    if (cli_rd_check != 0) {
      if (cli_rd_check != 1) {
LAB_001b1da5:
        pvVar7 = (void *)(ulong)(uint)uStack_90._20_4_;
        if (uStack_90._20_4_ != server_fd) {
LAB_001b1e5c:
          if ((extraout_EDX & 2) == 0) {
            return (int)pvVar7;
          }
          do {
            sVar6 = send(client_fd,"foo",3,0);
            if (-1 < (int)sVar6) break;
            piVar5 = __errno_location();
          } while (*piVar5 == 4);
          uStack_90.data = (void *)0x3;
          if ((int)sVar6 == 3) {
            return 3;
          }
          goto LAB_001b1edb;
        }
        do {
          sVar6 = recv(server_fd,(void *)((long)&uStack_90.loop + 4),3,0);
          iVar1 = (int)sVar6;
          if (iVar1 != -1) {
            if (-1 < iVar1) goto LAB_001b1dfb;
            piVar5 = __errno_location();
            iVar2 = *piVar5;
            break;
          }
          piVar5 = __errno_location();
          iVar2 = *piVar5;
        } while (iVar2 == 4);
        if (iVar2 != 0x16) {
LAB_001b1dfb:
          uStack_90.data = (void *)0x3;
          if (iVar1 != 3) goto LAB_001b1eed;
          iVar1 = strncmp((char *)((long)&uStack_90.loop + 4),"foo",3);
          uStack_90.data = (void *)(long)iVar1;
          if (uStack_90.data == (void *)0x0) {
            srv_rd_check = 1;
            uVar3 = uv_poll_stop(poll_req + 1);
            pvVar7 = (void *)(ulong)uVar3;
            goto LAB_001b1e5c;
          }
          goto LAB_001b1efa;
        }
        goto LAB_001b1f0c;
      }
      iVar2 = strncmp((char *)((long)&uStack_90.loop + 4),"world",(long)iVar1);
      uStack_90.data = (void *)(long)iVar2;
      if (uStack_90.data != (void *)0x0) goto LAB_001b1f11;
      uStack_90.data = (void *)0x5;
      if ((long)iVar1 == 5) {
        cli_rd_check = 2;
        goto LAB_001b1da5;
      }
      goto LAB_001b1f2b;
    }
    uStack_90.data = (void *)0x4;
    if (iVar1 != 4) goto LAB_001b1f1e;
    iVar1 = strncmp((char *)((long)&uStack_90.loop + 4),"hello",4);
    uStack_90.data = (void *)(long)iVar1;
    if (uStack_90.data == (void *)0x0) {
      cli_rd_check = 1;
      __s1 = (char *)((long)&uStack_90.loop + 4);
      do {
        while( true ) {
          puVar8 = (uv_handle_t *)(ulong)(uint)server_fd;
          sVar6 = recv(server_fd,__s1,5,0);
          uVar3 = (uint)sVar6;
          if (uVar3 == 0xffffffff) break;
          if ((int)uVar3 < 1) {
            piVar5 = __errno_location();
            iVar1 = *piVar5;
            goto LAB_001b1d97;
          }
          uStack_90.data = (void *)0x5;
          if ((uVar3 & 0x7fffffff) != 5) goto LAB_001b1f45;
          iVar1 = strncmp(__s1,"world",5);
          uStack_90.data = (void *)(long)iVar1;
          if (uStack_90.data != (void *)0x0) goto LAB_001b1f52;
          cli_rd_check = 2;
        }
        piVar5 = __errno_location();
        iVar1 = *piVar5;
      } while (iVar1 == 4);
LAB_001b1d97:
      if ((iVar1 != 0xb) && (iVar1 != 0x73)) goto LAB_001b1f5f;
      goto LAB_001b1da5;
    }
  }
  else {
    poll_cb_cold_1();
LAB_001b1ec1:
    poll_cb_cold_2();
LAB_001b1ece:
    poll_cb_cold_3();
LAB_001b1edb:
    poll_cb_cold_16();
LAB_001b1ee8:
    poll_cb_cold_4();
LAB_001b1eed:
    poll_cb_cold_12();
LAB_001b1efa:
    poll_cb_cold_13();
LAB_001b1f07:
    poll_cb_cold_15();
LAB_001b1f0c:
    poll_cb_cold_14();
LAB_001b1f11:
    poll_cb_cold_10();
LAB_001b1f1e:
    poll_cb_cold_5();
LAB_001b1f2b:
    poll_cb_cold_11();
  }
  poll_cb_cold_6();
LAB_001b1f45:
  poll_cb_cold_7();
LAB_001b1f52:
  puVar8 = &uStack_90;
  poll_cb_cold_8();
LAB_001b1f5f:
  poll_cb_cold_9();
  uv_sleep(100);
  iVar1 = ticks;
  ticks = ticks + 1;
  if (iVar1 < 9) {
    return iVar1;
  }
  uv_poll_stop(poll_req);
  uv_poll_stop(poll_req + 1);
  uv_close((uv_handle_t *)&server_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&client_handle,(uv_close_cb)0x0);
  uv_close((uv_handle_t *)&peer_handle,(uv_close_cb)0x0);
  uv_close(puVar8,(uv_close_cb)0x0);
  return extraout_EAX;
}

Assistant:

TEST_IMPL(poll_oob) {
  struct sockaddr_in addr;
  int r = 0;
  uv_loop_t* loop;

  ASSERT_OK(uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT_OK(uv_tcp_init(loop, &server_handle));
  ASSERT_OK(uv_tcp_init(loop, &client_handle));
  ASSERT_OK(uv_tcp_init(loop, &peer_handle));
  ASSERT_OK(uv_idle_init(loop, &idle));
  ASSERT_OK(uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT_OK(uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT_OK(uv_tcp_nodelay(&client_handle, 1));

  client_fd = socket(PF_INET, SOCK_STREAM, 0);
  ASSERT_GE(client_fd, 0);
  do {
    errno = 0;
    r = connect(client_fd, (const struct sockaddr*)&addr, sizeof(addr));
  } while (r == -1 && errno == EINTR);
  ASSERT_OK(r);

  ASSERT_OK(uv_run(loop, UV_RUN_DEFAULT));

  ASSERT_EQ(ticks, kMaxTicks);

  /* Did client receive the POLLPRI message */
  ASSERT_EQ(1, cli_pr_check);
  /* Did client receive the POLLIN message */
  ASSERT_EQ(2, cli_rd_check);
  /* Could we write with POLLOUT and did the server receive our POLLOUT message
   * through POLLIN.
   */
  ASSERT_EQ(1, srv_rd_check);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}